

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

void * drmp3__realloc_from_callbacks
                 (void *p,size_t szNew,size_t szOld,drmp3_allocation_callbacks *pAllocationCallbacks
                 )

{
  void *pvVar1;
  
  if (pAllocationCallbacks != (drmp3_allocation_callbacks *)0x0) {
    if (pAllocationCallbacks->onRealloc != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      pvVar1 = (*pAllocationCallbacks->onRealloc)(p,szNew,pAllocationCallbacks->pUserData);
      return pvVar1;
    }
    if (((pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) &&
        (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0)) &&
       (pvVar1 = (*pAllocationCallbacks->onMalloc)(szNew,pAllocationCallbacks->pUserData),
       pvVar1 != (void *)0x0)) {
      if (p == (void *)0x0) {
        return pvVar1;
      }
      (*SDL20_memcpy)(pvVar1,p,szOld);
      (*pAllocationCallbacks->onFree)(p,pAllocationCallbacks->pUserData);
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

static void* drmp3__realloc_from_callbacks(void* p, size_t szNew, size_t szOld, const drmp3_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks == NULL) {
        return NULL;
    }

    if (pAllocationCallbacks->onRealloc != NULL) {
        return pAllocationCallbacks->onRealloc(p, szNew, pAllocationCallbacks->pUserData);
    }

    /* Try emulating realloc() in terms of malloc()/free(). */
    if (pAllocationCallbacks->onMalloc != NULL && pAllocationCallbacks->onFree != NULL) {
        void* p2;

        p2 = pAllocationCallbacks->onMalloc(szNew, pAllocationCallbacks->pUserData);
        if (p2 == NULL) {
            return NULL;
        }

        if (p != NULL) {
            DRMP3_COPY_MEMORY(p2, p, szOld);
            pAllocationCallbacks->onFree(p, pAllocationCallbacks->pUserData);
        }

        return p2;
    }

    return NULL;
}